

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void * __thiscall
google::protobuf::Reflection::MutableRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  byte bVar1;
  FieldType field_type;
  int number;
  uint32_t uVar2;
  Descriptor *pDVar3;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar4;
  void *pvVar5;
  Nonnull<const_char_*> pcVar6;
  bool bVar7;
  char *description;
  char *method;
  LogMessage LStack_38;
  
  bVar1 = field->field_0x1;
  bVar7 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar7) {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar7,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) != 0) {
      pDVar3 = this->descriptor_;
      if (field->containing_type_ == pDVar3) {
        if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != cpptype)
           && ((cpptype != CPPTYPE_INT32 ||
               (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) !=
                CPPTYPE_ENUM)))) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"MutableRawRepeatedField",cpptype);
        }
        if (desc != (Descriptor *)0x0) {
          pDVar3 = FieldDescriptor::message_type(field);
          if (pDVar3 == desc) {
            pcVar6 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                               (pDVar3,desc,"field->message_type() == desc");
          }
          if (pcVar6 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&LStack_38,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                       ,0xac7,pcVar6);
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&LStack_38,(char (*) [22])"wrong submessage type");
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&LStack_38);
          }
        }
        if ((field->field_0x1 & 8) != 0) {
          uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          number = field->number_;
          field_type = field->type_;
          bVar7 = FieldDescriptor::is_packed(field);
          pvVar5 = internal::ExtensionSet::MutableRawRepeatedField
                             ((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2)
                              ,number,field_type,bVar7,field);
          return pvVar5;
        }
        if (field->type_ == '\v') {
          bVar7 = FieldDescriptor::is_map_message_type(field);
          if (bVar7) {
            VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
            this_00 = (MapFieldBase *)MutableRawNonOneofImpl(this,message,field);
            pRVar4 = internal::MapFieldBase::MutableRepeatedField(this_00);
            return pRVar4;
          }
        }
        pvVar5 = MutableRawNonOneofImpl(this,message,field);
        return pvVar5;
      }
      method = "MutableRawRepeatedField";
      description = "Field does not match message type.";
      goto LAB_002a711c;
    }
  }
  else {
    MutableRawRepeatedField();
  }
  pDVar3 = this->descriptor_;
  method = "\"MutableRawRepeatedField\"";
  description = "Field is singular; the method requires a repeated field.";
LAB_002a711c:
  anon_unknown_6::ReportReflectionUsageError(pDVar3,field,method,description);
}

Assistant:

void* Reflection::MutableRawRepeatedField(Message* message,
                                          const FieldDescriptor* field,
                                          FieldDescriptor::CppType cpptype,
                                          int ctype,
                                          const Descriptor* desc) const {
  (void)ctype;  // Parameter is used by Google-internal code.
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  USAGE_CHECK_MESSAGE_TYPE(MutableRawRepeatedField);

  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field,
                                   "MutableRawRepeatedField", cpptype);
  if (desc != nullptr)
    ABSL_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}